

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

char_t * __thiscall pugi::xml_node::child_value(xml_node *this)

{
  bool bVar1;
  xml_node_struct *local_20;
  xml_node_struct *i;
  xml_node *this_local;
  
  if (this->_root == (xml_node_struct *)0x0) {
    this_local = (xml_node *)0x238d2d;
  }
  else if ((((uint)this->_root->header & 0xf) == 2) && (this->_root->value != (char_t *)0x0)) {
    this_local = (xml_node *)this->_root->value;
  }
  else {
    for (local_20 = this->_root->first_child; local_20 != (xml_node_struct *)0x0;
        local_20 = local_20->next_sibling) {
      bVar1 = impl::anon_unknown_0::is_text_node(local_20);
      if ((bVar1) && (local_20->value != (char_t *)0x0)) {
        return local_20->value;
      }
    }
    this_local = (xml_node *)0x238d2d;
  }
  return (char_t *)this_local;
}

Assistant:

PUGI__FN const char_t* xml_node::child_value() const
	{
		if (!_root) return PUGIXML_TEXT("");

		// element nodes can have value if parse_embed_pcdata was used
		if (PUGI__NODETYPE(_root) == node_element && _root->value)
			return _root->value;

		for (xml_node_struct* i = _root->first_child; i; i = i->next_sibling)
			if (impl::is_text_node(i) && i->value)
				return i->value;

		return PUGIXML_TEXT("");
	}